

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O1

void printf_btr_mcp251x(can_bittiming *bt,_Bool hdr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("CNF1 CNF2 CNF3");
    return;
  }
  printf("0x%02x 0x%02x 0x%02x",(ulong)((bt->brp - 1 | bt->sjw * 0x40 + 0xc0) & 0xff),
         (ulong)((bt->prop_seg - 1 | bt->phase_seg1 * 8 + 0x78) & 0xff | 0x80),
         (ulong)(bt->phase_seg2 - 1 & 0xff));
  return;
}

Assistant:

static void printf_btr_mcp251x(struct can_bittiming *bt, bool hdr)
{
	uint8_t cnf1, cnf2, cnf3;

	if (hdr) {
		printf("CNF1 CNF2 CNF3");
	} else {
		cnf1 = ((bt->sjw - 1) << 6) | (bt->brp - 1);
		cnf2 = 0x80 | ((bt->phase_seg1 - 1) << 3) | (bt->prop_seg - 1);
		cnf3 = bt->phase_seg2 - 1;
		printf("0x%02x 0x%02x 0x%02x", cnf1, cnf2, cnf3);
	}
}